

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-print.cc
# Opt level: O2

void __thiscall IR::Print::visit(Print *this,Restore *s)

{
  fmt::v7::print<char[16],std::__cxx11::string_const&,char>
            (this->out,(char (*) [16])"\tyyrewind({0});",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &((s->super_tuple<const_IR::Temp_*>).super__Tuple_impl<0UL,_const_IR::Temp_*>.
               super__Head_base<0UL,_const_IR::Temp_*,_false>._M_head_impl)->
              super_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  std::endl<char,std::char_traits<char>>(this->out);
  return;
}

Assistant:

void Print::visit(IR::Restore* s) {
  fmt::print(out, "\tyyrewind({0});", s->source()->name());
  out << std::endl;
}